

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>
s2textformat::MakePolygonOrDie(string_view str,S2Debug debug_override)

{
  string_view str_00;
  bool bVar1;
  ostream *poVar2;
  absl *this;
  S2Debug in_CL;
  size_type sVar3;
  undefined7 in_register_00000011;
  __uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true> this_00;
  string_view piece;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [13];
  ostream *local_38;
  char *pcStack_30;
  undefined1 local_22;
  S2Debug local_21;
  ostream *poStack_20;
  S2Debug debug_override_local;
  string_view str_local;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *polygon;
  
  str_local.ptr_ = (char *)CONCAT71(in_register_00000011,debug_override);
  poStack_20 = (ostream *)str.length_;
  this_00.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
  super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
  super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl =
       (__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>)str.ptr_;
  local_22 = 0;
  local_21 = in_CL;
  str_local.length_ =
       (size_type)
       this_00.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
       super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
       super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl;
  std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>::
  unique_ptr<std::default_delete<S2Polygon>,void>
            ((unique_ptr<S2Polygon,std::default_delete<S2Polygon>> *)
             this_00.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
             super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
             super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl);
  local_38 = poStack_20;
  pcStack_30 = str_local.ptr_;
  str_00.length_ = (size_type)str_local.ptr_;
  str_00.ptr_ = (char *)poStack_20;
  bVar1 = MakePolygon(str_00,(unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)
                             this_00.
                             super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
                             super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
                             super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl,local_21);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
           (tuple<S2Polygon_*,_std::default_delete<S2Polygon>_>)
           this_00.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
           super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
           super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl;
  }
  sVar3 = 3;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0xfa,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_58);
  poVar2 = std::operator<<(poVar2,"Check failed: MakePolygon(str, &polygon, debug_override) ");
  this = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  piece.ptr_ = str_local.ptr_;
  poVar2 = absl::operator<<(this,poStack_20,piece);
  poVar2 = std::operator<<(poVar2,"\"");
  S2LogMessageVoidify::operator&(local_45,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
}

Assistant:

unique_ptr<S2Polygon> MakePolygonOrDie(string_view str,
                                       S2Debug debug_override) {
  unique_ptr<S2Polygon> polygon;
  S2_CHECK(MakePolygon(str, &polygon, debug_override))
      << ": str == \"" << str << "\"";
  return polygon;
}